

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O3

int __thiscall deqp::gls::DrawTestSpec::hash(DrawTestSpec *this)

{
  DrawMethod DVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  DVar1 = this->drawMethod;
  uVar2 = *(uint *)((anonymous_namespace)::getMethodInfo(deqp::gls::DrawTestSpec::DrawMethod)::infos
                   + (long)(int)DVar1 * 6);
  iVar5 = 0;
  iVar4 = 0;
  if ((uVar2 & 1) != 0) {
    iVar4 = this->indexStorage * 100 + this->indexPointerOffset * 10 + this->indexType;
  }
  if ((uVar2 >> 0x10 & 1) != 0) {
    iVar5 = (this->indexMax * 10 + this->indexMin) * 5;
  }
  iVar8 = this->first * 3;
  iVar9 = 0;
  if ((uVar2 >> 0x18 & 1) == 0) {
    iVar8 = 0;
  }
  iVar7 = this->instanceCount * 7;
  if ((uVar2 >> 8 & 1) == 0) {
    iVar7 = iVar9;
  }
  iVar3 = this->indirectOffset * 0x17;
  if ((*(ushort *)
        ((anonymous_namespace)::getMethodInfo(deqp::gls::DrawTestSpec::DrawMethod)::infos +
        (long)(int)DVar1 * 6 + 4) & 0x100) == 0) {
    iVar3 = iVar9;
  }
  iVar6 = this->baseVertex * 0x1b;
  if ((*(ushort *)
        ((anonymous_namespace)::getMethodInfo(deqp::gls::DrawTestSpec::DrawMethod)::infos +
        (long)(int)DVar1 * 6 + 4) & 1) == 0) {
    iVar6 = iVar9;
  }
  return iVar3 + iVar7 + iVar4 + iVar5 + iVar8 +
         this->primitiveCount * 0x13 + iVar6 +
         (DVar1 * 100 + this->primitive + this->primitiveCount * 10) * 0xd +
         (int)((ulong)((long)(this->attribs).
                             super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->attribs).
                            super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x66666663;
}

Assistant:

int DrawTestSpec::hash (void) const
{
	// Use only drawmode-relevant values in "hashing" as the unrelevant values might not be set (causing non-deterministic behavior).
	const MethodInfo	methodInfo		= getMethodInfo(drawMethod);
	const bool			arrayed			= methodInfo.first;
	const bool			instanced		= methodInfo.instanced;
	const bool			ranged			= methodInfo.ranged;
	const bool			indexed			= methodInfo.indexed;
	const bool			indirect		= methodInfo.indirect;
	const bool			hasBaseVtx		= methodInfo.baseVertex;

	const int			indexHash		= (!indexed)	? (0) : (int(indexType) + 10 * indexPointerOffset + 100 * int(indexStorage));
	const int			arrayHash		= (!arrayed)	? (0) : (first);
	const int			indexRangeHash	= (!ranged)		? (0) : (indexMin + 10 * indexMax);
	const int			instanceHash	= (!instanced)	? (0) : (instanceCount);
	const int			indirectHash	= (!indirect)	? (0) : (indirectOffset);
	const int			baseVtxHash		= (!hasBaseVtx)	? (0) : (baseVertex);
	const int			basicHash		= int(primitive) + 10 * primitiveCount + 100 * int(drawMethod);

	return indexHash + 3 * arrayHash + 5 * indexRangeHash + 7 * instanceHash + 13 * basicHash + 17 * (int)attribs.size() + 19 * primitiveCount + 23 * indirectHash + 27 * baseVtxHash;
}